

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_cmp_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                   uint32_t bofs,uint32_t oprsz,uint32_t tysz,TCGType_conflict type,TCGCond cond)

{
  TCGv_vec arg;
  TCGv_vec arg_00;
  uint local_3c;
  uint32_t i;
  TCGv_vec t1;
  TCGv_vec t0;
  uint32_t oprsz_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_vec_tricore(tcg_ctx,type);
  arg_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (local_3c = 0; local_3c < oprsz; local_3c = tysz + local_3c) {
    tcg_gen_ld_vec_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_3c));
    tcg_gen_ld_vec_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(bofs + local_3c));
    tcg_gen_cmp_vec_tricore(tcg_ctx,cond,vece,arg,arg,arg_00);
    tcg_gen_st_vec_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_3c));
  }
  tcg_temp_free_vec(tcg_ctx,arg_00);
  tcg_temp_free_vec(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_cmp_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                           uint32_t bofs, uint32_t oprsz, uint32_t tysz,
                           TCGType type, TCGCond cond)
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_vec(tcg_ctx, t1, tcg_ctx->cpu_env, bofs + i);
        tcg_gen_cmp_vec(tcg_ctx, cond, vece, t0, t0, t1);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t1);
    tcg_temp_free_vec(tcg_ctx, t0);
}